

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * __thiscall
cmCustomCommandGenerator::GetCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,uint c)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_reference pvVar2;
  allocator<char> local_49;
  char *local_48;
  char *location;
  allocator<char> local_29;
  char *local_28;
  char *emulator;
  cmCustomCommandGenerator *pcStack_18;
  uint c_local;
  cmCustomCommandGenerator *this_local;
  
  emulator._4_4_ = c;
  pcStack_18 = this;
  this_local = (cmCustomCommandGenerator *)__return_storage_ptr__;
  pcVar1 = GetCrossCompilingEmulator(this,c);
  local_28 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = GetArgv0Location(this,emulator._4_4_);
    local_48 = pcVar1;
    if (pcVar1 == (char *)0x0) {
      this_00 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                           (&(this->CommandLines).
                             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                            ,(ulong)emulator._4_4_)->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,0);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar1,&local_49);
      std::allocator<char>::~allocator(&local_49);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetCommand(unsigned int c) const
{
  if (const char* emulator = this->GetCrossCompilingEmulator(c)) {
    return std::string(emulator);
  }
  if (const char* location = this->GetArgv0Location(c)) {
    return std::string(location);
  }

  return this->CommandLines[c][0];
}